

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9MemObjRelease(jx9_value *pObj)

{
  jx9_value *pObj_local;
  
  if ((pObj->iFlags & 0x20U) == 0) {
    if ((pObj->iFlags & 0x40U) != 0) {
      jx9HashmapUnref((jx9_hashmap *)(pObj->x).pOther);
    }
    SyBlobRelease(&pObj->sBlob);
    pObj->iFlags = 0x20;
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjRelease(jx9_value *pObj)
{
	if( (pObj->iFlags & MEMOBJ_NULL) == 0 ){
		if( pObj->iFlags & MEMOBJ_HASHMAP ){
			jx9HashmapUnref((jx9_hashmap *)pObj->x.pOther);
		}
		/* Release the internal buffer */
		SyBlobRelease(&pObj->sBlob);
		/* Invalidate any prior representation */
		pObj->iFlags = MEMOBJ_NULL;
	}
	return SXRET_OK;
}